

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage0.c
# Opt level: O1

HCOSE_MAC0 COSE_Mac0_Init(COSE_INIT_FLAGS flags,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  COSE *pobj;
  
  if (flags == COSE_INIT_FLAGS_NONE) {
    pobj = (COSE *)calloc(1,0x60);
    if (pobj != (COSE *)0x0) {
      _Var1 = _COSE_Init(COSE_INIT_FLAGS_NONE,pobj,0x11,perr);
      if (_Var1) {
        _COSE_InsertInList(&Mac0Root,pobj);
        return (HCOSE_MAC0)pobj;
      }
      goto LAB_00203d65;
    }
    cVar2 = COSE_ERR_OUT_OF_MEMORY;
  }
  else {
    cVar2 = COSE_ERR_INVALID_PARAMETER;
  }
  if (perr != (cose_errback *)0x0) {
    perr->err = cVar2;
  }
  pobj = (COSE *)0x0;
LAB_00203d65:
  if (pobj != (COSE *)0x0) {
    _COSE_Release(pobj);
    free(pobj);
  }
  return (HCOSE_MAC0)0x0;
}

Assistant:

HCOSE_MAC0 COSE_Mac0_Init(COSE_INIT_FLAGS flags, CBOR_CONTEXT_COMMA cose_errback * perr)
{
	COSE_Mac0Message * pobj = NULL;

	CHECK_CONDITION(flags == COSE_INIT_FLAGS_NONE, COSE_ERR_INVALID_PARAMETER);

	pobj = (COSE_Mac0Message *)COSE_CALLOC(1, sizeof(COSE_Mac0Message), context);
	CHECK_CONDITION(pobj != NULL, COSE_ERR_OUT_OF_MEMORY);

	if (!_COSE_Init(flags, &pobj->m_message, COSE_mac0_object, CBOR_CONTEXT_PARAM_COMMA perr)) {
		goto errorReturn;
	}

	_COSE_InsertInList(&Mac0Root, &pobj->m_message);

	return (HCOSE_MAC0)pobj;

errorReturn:
	if (pobj != NULL) {
		_COSE_Mac0_Release(pobj);
		COSE_FREE(pobj, context);
	}
	return NULL;
}